

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void inputSwitchDirection(MatrixXd *X,MatrixXd *u)

{
  long lVar1;
  undefined1 auVar2 [16];
  Index size;
  undefined8 *puVar3;
  long lVar4;
  double *pdVar5;
  ActualDstType actualDst;
  double *pdVar6;
  Index i;
  Index dstCols;
  long lVar7;
  VectorXd temp1;
  VectorXd temp2;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  pdVar6 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  if ((lVar7 != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816(lVar7),0) < 1)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8,u,SUB168(auVar2 % SEXT816(lVar7),0));
    *puVar3 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,lVar7,1);
  lVar1 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_48.m_storage.m_rows != lVar7) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,lVar7,1);
    lVar7 = local_48.m_storage.m_rows;
  }
  if (0 < lVar7) {
    lVar4 = 0;
    do {
      local_48.m_storage.m_data[lVar4] = *pdVar6;
      lVar4 = lVar4 + 1;
      pdVar6 = pdVar6 + lVar1;
    } while (lVar7 != lVar4);
  }
  pdVar6 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar7 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  if ((lVar7 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar7),0) < 1)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,lVar7,1);
  lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_38.m_storage.m_rows != lVar7) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,lVar7,1);
    lVar7 = local_38.m_storage.m_rows;
  }
  if (0 < lVar7) {
    lVar4 = 0;
    do {
      local_38.m_storage.m_data[lVar4] = *pdVar6;
      lVar4 = lVar4 + 1;
      pdVar6 = pdVar6 + lVar1;
    } while (lVar7 != lVar4);
  }
  lVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar7) {
    lVar1 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    pdVar5 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             + 1;
    pdVar6 = pdVar5;
    lVar4 = lVar7;
    do {
      pdVar6[-1] = *pdVar6;
      pdVar6 = pdVar6 + lVar1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar4 = 0;
    do {
      *pdVar5 = local_48.m_storage.m_data[lVar4];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + lVar1;
    } while (lVar7 != lVar4);
  }
  lVar7 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar7) {
    lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    pdVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             + 1;
    pdVar6 = pdVar5;
    lVar4 = lVar7;
    do {
      pdVar6[-1] = *pdVar6;
      pdVar6 = pdVar6 + lVar1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar4 = 0;
    do {
      *pdVar5 = local_38.m_storage.m_data[lVar4];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + lVar1;
    } while (lVar7 != lVar4);
  }
  free(local_38.m_storage.m_data);
  free(local_48.m_storage.m_data);
  return;
}

Assistant:

void inputSwitchDirection(Eigen::MatrixXd &X, Eigen::MatrixXd &u){
	Eigen::VectorXd temp1 = X.row(0);
	Eigen::VectorXd temp2 = u.row(0);
	X.row(0) = X.row(1);
	X.row(1) = temp1;
	u.row(0) = u.row(1);
	u.row(1) = temp2; 
}